

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkForeachIteratorCapturedByClosure
          (CheckerVisitor *this,Id *id,ValueRef *v)

{
  int iVar1;
  FunctionDecl *pFVar2;
  pointer pSVar3;
  Node *pNVar4;
  long lVar5;
  _func_int **pp_Var6;
  SQChar *str;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  long lStack_20;
  
  if (((this->effectsOnly != false) || (v->info->kind != SK_FOREACH)) ||
     (pFVar2 = this->currentScope->owner, v->info->ownedScope->owner == pFVar2)) {
    return;
  }
  pSVar3 = (this->nodeStack).
           super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)(this->nodeStack).
                        super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 4;
  uVar10 = (uVar9 & 0xffffffff) + 0xfffffffe;
  lVar11 = (uVar9 & 0xffffffff) - 1;
  do {
    uVar8 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 0) goto LAB_001439a2;
    uVar12 = (uint)lVar11 & 0x7fffffff;
    uVar10 = uVar10 - 1;
    lVar11 = lVar11 + -1;
  } while ((pSVar3[uVar12].sst != SST_NODE) || ((FunctionDecl *)pSVar3[uVar12].field_1.n != pFVar2))
  ;
  if ((2 < uVar8) &&
     ((pSVar3[uVar10 & 0xffffffff].sst == SST_NODE &&
      (pNVar4 = pSVar3[uVar10 & 0xffffffff].field_1.n, pNVar4->_op == TO_CALL)))) {
    for (lVar11 = 0; (ulong)pNVar4[1]._op << 3 != lVar11; lVar11 = lVar11 + 8) {
      lVar5 = *(long *)(*(long *)&pNVar4[1]._coordinates.lineEnd + lVar11);
      if ((*(int *)(lVar5 + 0x18) == 0x3d) && (*(FunctionDecl **)(lVar5 + 0x20) == pFVar2)) {
        pp_Var6 = pNVar4[1].super_ArenaObj._vptr_ArenaObj;
        iVar1 = *(int *)(pp_Var6 + 3);
        if (iVar1 == 0x11) {
          lStack_20 = 0x20;
        }
        else {
          if (iVar1 != 0x3f) break;
          lStack_20 = 0x30;
        }
        str = *(SQChar **)((long)pp_Var6 + lStack_20);
        if ((str != (SQChar *)0x0) &&
           (bVar7 = hasAnyEqual(str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)SQCompilationContext::
                                       function_calls_lambda_inplace_abi_cxx11_), bVar7)) {
          return;
        }
        break;
      }
    }
  }
LAB_001439a2:
  report(this,(Node *)id,0x71,id->_id);
  return;
}

Assistant:

void CheckerVisitor::checkForeachIteratorCapturedByClosure(const Id *id, const ValueRef *v) {
  if (effectsOnly)
    return;

  if (v->info->kind != SK_FOREACH)
    return;

  const FunctionDecl *thisScopeOwner = currentScope->owner;

  if (v->info->ownedScope->owner == currentScope->owner)
    return;

  int32_t i = nodeStack.size() - 1;
  assert(i > 0);

  int32_t thisId = -1;
  auto rit = nodeStack.rbegin();
  auto rie = nodeStack.rend();

  while (i >= 0) {
    auto &m = nodeStack[i];

    if (m.sst == SST_NODE) {
      if (m.n == thisScopeOwner) {
        thisId = i;
        break;
      }
    }
    --i;
  }

  assert(thisId > 0);

  if (i > 2) { // decl_expr + call + foreach

    auto &candidate = nodeStack[i - 2];

    if (candidate.sst == SST_NODE && candidate.n->op() == TO_CALL) {
      const CallExpr *call = candidate.n->asExpression()->asCallExpr();

      bool found = false;
      for (auto arg : call->arguments()) {
        if (arg->op() == TO_DECL_EXPR && arg->asDeclExpr()->declaration() == thisScopeOwner) {
          found = true;
          break;
        }
      }

      if (found) {// in call arguments
        const Expr *callee = call->callee();
        const SQChar *name = nullptr;

        if (callee->op() == TO_ID)
          name = callee->asId()->id();
        else if (callee->op() == TO_GETFIELD)
          name = callee->asGetField()->fieldName();

        if (name && nameLooksLikeCallsLambdaInPlace(name)) {
          return;
        }
      }
    }
  }

  report(id, DiagnosticsId::DI_ITER_IN_CLOSURE, id->id());
}